

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  uint uVar1;
  uint uVar2;
  ImGuiTabBar *pIVar3;
  ImGuiTabBar *__dest;
  int iVar4;
  int iVar5;
  int iVar6;
  
  uVar1 = (this->Buf).Size;
  uVar2 = this->FreeIdx;
  if (uVar2 == uVar1) {
    iVar5 = uVar2 + 1;
    iVar6 = (this->Buf).Capacity;
    iVar4 = iVar5;
    if (iVar6 <= (int)uVar2) {
      if (iVar6 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar6 / 2 + iVar6;
      }
      if (iVar6 <= iVar5) {
        iVar6 = iVar5;
      }
      __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar6 * 0x98);
      pIVar3 = (this->Buf).Data;
      if (pIVar3 != (ImGuiTabBar *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->Buf).Size * 0x98);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar6;
      iVar4 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar5;
    this->FreeIdx = iVar4;
    if ((int)uVar2 < 0) goto LAB_0015ab71;
  }
  else {
    if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) goto LAB_0015ab71;
    this->FreeIdx = (this->Buf).Data[uVar2].Tabs.Size;
  }
  pIVar3 = (this->Buf).Data;
  memset(pIVar3 + uVar2,0,0x98);
  pIVar3[uVar2].CurrFrameVisible = -1;
  pIVar3[uVar2].PrevFrameVisible = -1;
  pIVar3[uVar2].LastTabItemIdx = -1;
  this->AliveCount = this->AliveCount + 1;
  if ((int)uVar2 < (this->Buf).Size) {
    return (this->Buf).Data + uVar2;
  }
LAB_0015ab71:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }